

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_state_52.cpp
# Opt level: O0

vector<lua_State_*,_std::allocator<lua_State_*>_> *
FindAllCoroutine_lua52
          (vector<lua_State_*,_std::allocator<lua_State_*>_> *__return_storage_ptr__,
          lua_State_conflict1 *L)

{
  GCObject_conflict *local_30;
  GCObject_conflict *local_28;
  GCObject_conflict *head;
  lua_State_conflict1 *local_18;
  lua_State_conflict1 *L_local;
  vector<lua_State_*,_std::allocator<lua_State_*>_> *result;
  
  head._7_1_ = 0;
  local_18 = L;
  L_local = (lua_State_conflict1 *)__return_storage_ptr__;
  std::vector<lua_State_*,_std::allocator<lua_State_*>_>::vector(__return_storage_ptr__);
  for (local_28 = local_18->l_G->allgc; local_28 != (GCObject_conflict *)0x0;
      local_28 = (local_28->gch).next) {
    if ((local_28->gch).tt == '\b') {
      local_30 = local_28;
      std::vector<lua_State_*,_std::allocator<lua_State_*>_>::push_back
                (__return_storage_ptr__,(value_type *)&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lua_State*> FindAllCoroutine_lua52(lua_State* L)
{
	std::vector<lua_State*> result;
	auto head = G(L)->allgc;

	while (head)
	{
		if (head->gch.tt == LUA_TTHREAD)
		{
			result.push_back(reinterpret_cast<lua_State*>(head));
		}
		head = head->gch.next;
	}

	return result;
}